

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1objs.c
# Opt level: O3

void T1_Face_Done(FT_Face t1face)

{
  FT_Memory memory;
  void *P;
  T1_Face face;
  
  if (t1face != (FT_Face)0x0) {
    memory = t1face->memory;
    P = (void *)t1face[3].bbox.yMax;
    if (P != (void *)0x0) {
      ft_mem_free(memory,P);
      t1face[3].bbox.yMax = 0;
      *(undefined4 *)&t1face[3].bbox.xMax = 0;
    }
    T1_Done_Blend((T1_Face)t1face);
    t1face[3].bbox.xMin = 0;
    ft_mem_free(memory,(void *)t1face[1].num_faces);
    t1face[1].num_faces = 0;
    ft_mem_free(memory,(void *)t1face[1].face_index);
    t1face[1].face_index = 0;
    ft_mem_free(memory,(void *)t1face[1].face_flags);
    t1face[1].face_flags = 0;
    ft_mem_free(memory,(void *)t1face[1].style_flags);
    t1face[1].style_flags = 0;
    ft_mem_free(memory,(void *)t1face[1].num_glyphs);
    t1face[1].num_glyphs = 0;
    ft_mem_free(memory,t1face[2].charmap);
    t1face[2].charmap = (FT_CharMap)0x0;
    ft_mem_free(memory,t1face[2].size);
    t1face[2].size = (FT_Size)0x0;
    ft_mem_free(memory,t1face[2].glyph);
    t1face[2].glyph = (FT_GlyphSlot_conflict)0x0;
    ft_mem_free(memory,(void *)t1face[2].bbox.xMax);
    t1face[2].bbox.xMax = 0;
    ft_mem_free(memory,(void *)t1face[2].bbox.yMax);
    t1face[2].bbox.yMax = 0;
    ft_hash_str_free(*(FT_Hash *)&t1face[2].units_per_EM,memory);
    ft_mem_free(memory,*(void **)&t1face[2].units_per_EM);
    t1face[2].units_per_EM = 0;
    t1face[2].ascender = 0;
    t1face[2].descender = 0;
    t1face[2].height = 0;
    ft_mem_free(memory,t1face[2].generic.data);
    t1face[2].generic.data = (void *)0x0;
    ft_mem_free(memory,t1face[2].generic.finalizer);
    t1face[2].generic.finalizer = (FT_Generic_Finalizer)0x0;
    ft_mem_free(memory,(void *)t1face[2].bbox.xMin);
    t1face[2].bbox.xMin = 0;
    ft_mem_free(memory,*(void **)&t1face[2].num_charmaps);
    *(undefined8 *)&t1face[2].num_charmaps = 0;
    ft_mem_free(memory,t1face[2].charmaps);
    t1face[2].charmaps = (FT_CharMap *)0x0;
    ft_mem_free(memory,t1face[2].family_name);
    t1face[2].family_name = (FT_String *)0x0;
    if ((AFM_FontInfo)t1face[3].style_name != (AFM_FontInfo)0x0) {
      T1_Done_Metrics(memory,(AFM_FontInfo)t1face[3].style_name);
    }
    t1face->family_name = (FT_String *)0x0;
    t1face->style_name = (FT_String *)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  T1_Face_Done( FT_Face  t1face )         /* T1_Face */
  {
    T1_Face    face = (T1_Face)t1face;
    FT_Memory  memory;
    T1_Font    type1;


    if ( !face )
      return;

    memory = face->root.memory;
    type1  = &face->type1;

#ifndef T1_CONFIG_OPTION_NO_MM_SUPPORT
    /* release multiple masters information */
    FT_ASSERT( ( face->len_buildchar == 0 ) == ( face->buildchar == NULL ) );

    if ( face->buildchar )
    {
      FT_FREE( face->buildchar );

      face->buildchar     = NULL;
      face->len_buildchar = 0;
    }

    T1_Done_Blend( face );
    face->blend = NULL;
#endif

    /* release font info strings */
    {
      PS_FontInfo  info = &type1->font_info;


      FT_FREE( info->version );
      FT_FREE( info->notice );
      FT_FREE( info->full_name );
      FT_FREE( info->family_name );
      FT_FREE( info->weight );
    }

    /* release top dictionary */
    FT_FREE( type1->charstrings_len );
    FT_FREE( type1->charstrings );
    FT_FREE( type1->glyph_names );

    FT_FREE( type1->subrs );
    FT_FREE( type1->subrs_len );

    ft_hash_num_free( type1->subrs_hash, memory );
    FT_FREE( type1->subrs_hash );

    FT_FREE( type1->subrs_block );
    FT_FREE( type1->charstrings_block );
    FT_FREE( type1->glyph_names_block );

    FT_FREE( type1->encoding.char_index );
    FT_FREE( type1->encoding.char_name );
    FT_FREE( type1->font_name );

#ifndef T1_CONFIG_OPTION_NO_AFM
    /* release afm data if present */
    if ( face->afm_data )
      T1_Done_Metrics( memory, (AFM_FontInfo)face->afm_data );
#endif

    /* release unicode map, if any */
#if 0
    FT_FREE( face->unicode_map_rec.maps );
    face->unicode_map_rec.num_maps = 0;
    face->unicode_map              = NULL;
#endif

    face->root.family_name = NULL;
    face->root.style_name  = NULL;
  }